

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

LoggerId __thiscall
zsummer::log4z::CLogerManager::CreateLogger
          (CLogerManager *this,char *name,char *path,int nLevel,bool display,bool monthdir,
          uint limitsize)

{
  iterator iVar1;
  _Rb_tree_color *p_Var2;
  uint uVar3;
  undefined3 in_register_00000081;
  _Rb_tree_color _Var4;
  allocator<char> local_b5;
  undefined4 local_b4;
  key_type local_b0;
  string fullpath;
  string _pid;
  string _tmp;
  
  local_b4 = CONCAT31(in_register_00000081,display);
  _tmp._M_dataplus._M_p = (pointer)&_tmp.field_2;
  _tmp._M_string_length = 0;
  _tmp.field_2._M_local_buf[0] = '\0';
  _pid._M_dataplus._M_p = (pointer)&_pid.field_2;
  _pid._M_string_length = 0;
  _pid.field_2._M_local_buf[0] = '\0';
  GetProcessInfo(&_tmp,&_pid);
  if (*name == '\0') {
    ShowColorText("log4z: create logger error, name is empty ! \r\n",5);
    _Var4 = ~_S_red;
    goto LAB_0011b21a;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullpath,path,(allocator<char> *)&local_b0);
  TrimLogConfig(&fullpath,'\0');
  FixPath(&fullpath);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,name,&local_b5);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_ids)._M_t,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->m_ids)._M_t._M_impl.super__Rb_tree_header) ||
     (_Var4 = iVar1._M_node[2]._M_color, _Var4 == ~_S_red)) {
    if (this->m_lastId < 9) {
      _Var4 = this->m_lastId + _S_black;
      this->m_lastId = _Var4;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,name,&local_b5);
      p_Var2 = (_Rb_tree_color *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->m_ids,&local_b0);
      *p_Var2 = _Var4;
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_0011b179;
    }
    ShowColorText("log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n"
                  ,5);
    _Var4 = ~_S_red;
  }
  else {
LAB_0011b179:
    if (fullpath._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_loggers[(int)_Var4]._path);
    }
    if (0 < (int)_Var4) {
      std::__cxx11::string::assign((char *)(this->m_loggers + _Var4));
    }
    std::__cxx11::string::_M_assign((string *)&this->m_loggers[(int)_Var4]._pid);
    this->m_loggers[(int)_Var4]._level = nLevel;
    this->m_loggers[(int)_Var4]._enable = true;
    this->m_loggers[(int)_Var4]._display = SUB41(local_b4,0);
    this->m_loggers[(int)_Var4]._monthdir = monthdir;
    uVar3 = 4000;
    if (limitsize != 0) {
      uVar3 = limitsize;
    }
    this->m_loggers[(int)_Var4]._limitsize = uVar3;
  }
  std::__cxx11::string::~string((string *)&fullpath);
LAB_0011b21a:
  std::__cxx11::string::~string((string *)&_pid);
  std::__cxx11::string::~string((string *)&_tmp);
  return _Var4;
}

Assistant:

virtual LoggerId CreateLogger(const char* name,const char* path,int nLevel,bool display, bool monthdir, unsigned int limitsize)
	{
		std::string _tmp;
		std::string _pid;
		GetProcessInfo(_tmp, _pid);
		if (strlen(name) == 0)
		{
			ShowColorText("log4z: create logger error, name is empty ! \r\n", LOG_LEVEL_FATAL);
			return -1;
		}
		std::string fullpath = path;
		TrimLogConfig(fullpath);
		FixPath(fullpath);

		LoggerId newID = -1;
		{
			std::map<std::string, LoggerId>::iterator iter = m_ids.find(name);
			if (iter != m_ids.end())
			{
				newID = iter->second;
			}
		}
		if (newID == -1)
		{
			if (m_lastId +1 >= LOG4Z_LOGGER_MAX)
			{
				ShowColorText("log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n", LOG_LEVEL_FATAL);
				return -1;
			}
			newID = ++ m_lastId;
			m_ids[name] = newID;
		}

		if (!fullpath.empty())
		{
			m_loggers[newID]._path = fullpath;
		}

		if (newID > LOG4Z_MAIN_LOGGER_ID)
		{
			m_loggers[newID]._name = name;
		}
		m_loggers[newID]._pid = _pid;
		m_loggers[newID]._level = nLevel;
		m_loggers[newID]._enable = true;
		m_loggers[newID]._display = display;
		m_loggers[newID]._monthdir = monthdir;
		m_loggers[newID]._limitsize = limitsize;
		if (limitsize == 0)
		{
			m_loggers[newID]._limitsize = 4000;
		}

		return newID;
	}